

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void __thiscall
zmq::mechanism_t::make_command_with_basic_properties
          (mechanism_t *this,msg_t *msg_,char *prefix_,size_t prefix_len_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  void *__dest;
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  mechanism_t *unaff_retaddr;
  uchar *ptr;
  char *errstr;
  int rc;
  size_t command_size;
  size_t in_stack_ffffffffffffffa0;
  msg_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  basic_properties_len((mechanism_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  iVar1 = msg_t::init_size(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mechanism.cpp"
            ,0xe1);
    fflush(_stderr);
    zmq_abort((char *)0x247788);
  }
  __dest = msg_t::data(in_stack_ffffffffffffffa8);
  memcpy(__dest,in_RDX,in_RCX);
  msg_t::data((msg_t *)(in_RCX + (long)__dest));
  add_basic_properties(unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void zmq::mechanism_t::make_command_with_basic_properties (
  msg_t *msg_, const char *prefix_, size_t prefix_len_) const
{
    const size_t command_size = prefix_len_ + basic_properties_len ();
    const int rc = msg_->init_size (command_size);
    errno_assert (rc == 0);

    unsigned char *ptr = static_cast<unsigned char *> (msg_->data ());

    //  Add prefix
    memcpy (ptr, prefix_, prefix_len_);
    ptr += prefix_len_;

    add_basic_properties (
      ptr, command_size - (ptr - static_cast<unsigned char *> (msg_->data ())));
}